

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

char * classend(MatchState *ms,char *p)

{
  char *pcVar1;
  char *pcVar2;
  lua_State *L;
  
  pcVar2 = p + 1;
  if (*p == '[') {
    if (p[1] == '^') {
      pcVar2 = p + 2;
    }
    do {
      if (*pcVar2 == '\0') {
        L = ms->L;
        pcVar2 = "malformed pattern (missing \']\')";
        goto LAB_00112e6f;
      }
      pcVar1 = pcVar2 + 1;
      if ((*pcVar2 == '%') && (pcVar2[1] != '\0')) {
        pcVar1 = pcVar2 + 2;
      }
      pcVar2 = pcVar1;
    } while (*pcVar2 != ']');
    pcVar2 = pcVar2 + 1;
  }
  else if (*p == '%') {
    if (*pcVar2 == '\0') {
      L = ms->L;
      pcVar2 = "malformed pattern (ends with \'%%\')";
LAB_00112e6f:
      luaL_error(L,pcVar2);
    }
    pcVar2 = p + 2;
  }
  return pcVar2;
}

Assistant:

static const char*classend(MatchState*ms,const char*p){
switch(*p++){
case'%':{
if(*p=='\0')
luaL_error(ms->L,"malformed pattern (ends with "LUA_QL("%%")")");
return p+1;
}
case'[':{
if(*p=='^')p++;
do{
if(*p=='\0')
luaL_error(ms->L,"malformed pattern (missing "LUA_QL("]")")");
if(*(p++)=='%'&&*p!='\0')
p++;
}while(*p!=']');
return p+1;
}
default:{
return p;
}
}
}